

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn.c
# Opt level: O2

void cmn_free(cmn_t *cmn)

{
  if (cmn != (cmn_t *)0x0) {
    if (cmn->cmn_var != (mfcc_t *)0x0) {
      ckd_free(cmn->cmn_var);
    }
    if (cmn->cmn_mean != (mfcc_t *)0x0) {
      ckd_free(cmn->cmn_mean);
    }
    if (cmn->sum != (mfcc_t *)0x0) {
      ckd_free(cmn->sum);
    }
    ckd_free(cmn);
    return;
  }
  return;
}

Assistant:

void
cmn_free(cmn_t * cmn)
{
    if (cmn != NULL) {
        if (cmn->cmn_var)
            ckd_free((void *) cmn->cmn_var);

        if (cmn->cmn_mean)
            ckd_free((void *) cmn->cmn_mean);

        if (cmn->sum)
            ckd_free((void *) cmn->sum);

        ckd_free((void *) cmn);
    }
}